

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

void __thiscall
deqp::sl::ShaderCase::specializeShaders
          (ShaderCase *this,char *vertexSource,char *fragmentSource,string *outVertexSource,
          string *outFragmentSource,ValueBlock *valueBlock)

{
  bool bVar1;
  DataType DVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  char *pcVar7;
  long lVar8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var9;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  undefined1 local_9f8 [8];
  StringTemplate tmpl_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c8;
  _Base_ptr local_988;
  undefined1 local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_958;
  _Base_ptr local_918;
  undefined1 local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e8;
  undefined1 local_8a8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params_1;
  char *refTypeStr;
  char *valueName;
  Value *val_1;
  char *pcStack_858;
  int ndx_1;
  char *fragColor;
  ostringstream output;
  ostringstream decl_1;
  allocator<char> local_539;
  string local_538;
  undefined1 local_518 [8];
  StringTemplate tmpl;
  allocator<char> local_4e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c0;
  _Base_ptr local_480;
  undefined1 local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_450;
  _Base_ptr local_410;
  undefined1 local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  undefined1 local_3a0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  char *floatTypeStr;
  DataType floatType;
  char *typeStr;
  Value *val;
  int ndx;
  char *vtxIn;
  undefined1 local_330 [8];
  ostringstream setup;
  ostringstream decl;
  bool customColorOut;
  bool usesInout;
  ValueBlock *valueBlock_local;
  string *outFragmentSource_local;
  string *outVertexSource_local;
  char *fragmentSource_local;
  char *vertexSource_local;
  ShaderCase *this_local;
  
  bVar1 = usesShaderInoutQualifiers(this->m_targetVersion);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
  pcVar3 = "attribute";
  if (bVar1) {
    pcVar3 = "in";
  }
  poVar4 = std::operator<<((ostream *)&setup.field_0x170,pcVar3);
  std::operator<<(poVar4," highp vec4 dEQP_Position;\n");
  for (val._4_4_ = 0;
      sVar5 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ::size(&valueBlock->values), val._4_4_ < (int)sVar5; val._4_4_ = val._4_4_ + 1) {
    pvVar6 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[](&valueBlock->values,(long)val._4_4_);
    pcVar7 = glu::getDataTypeName(pvVar6->dataType);
    if (pvVar6->storageType == STORAGE_INPUT) {
      DVar2 = glu::getDataTypeScalarType(pvVar6->dataType);
      if (DVar2 == TYPE_FLOAT) {
        poVar4 = std::operator<<((ostream *)&setup.field_0x170,pcVar3);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,pcVar7);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
        std::operator<<(poVar4,";\n");
      }
      else {
        DVar2 = glu::getDataTypeFloatScalars(pvVar6->dataType);
        params._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)glu::getDataTypeName(DVar2);
        poVar4 = std::operator<<((ostream *)&setup.field_0x170,pcVar3);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,(char *)params._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count);
        poVar4 = std::operator<<(poVar4," a_");
        poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
        std::operator<<(poVar4,";\n");
        poVar4 = std::operator<<((ostream *)local_330,pcVar7);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
        poVar4 = std::operator<<(poVar4," = ");
        poVar4 = std::operator<<(poVar4,pcVar7);
        poVar4 = std::operator<<(poVar4,"(a_");
        poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
        std::operator<<(poVar4,");\n");
      }
    }
    else if ((pvVar6->storageType == STORAGE_UNIFORM) &&
            (lVar8 = std::__cxx11::string::find((char)pvVar6 + '\b',0x2e), lVar8 == -1)) {
      poVar4 = std::operator<<((ostream *)&setup.field_0x170,"uniform ");
      poVar4 = std::operator<<(poVar4,pcVar7);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
      std::operator<<(poVar4,";\n");
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_3a0);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3e0,(char (*) [20])"VERTEX_DECLARATIONS",&local_400);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_3a0,&local_3e0);
  local_410 = (_Base_ptr)_Var9.first._M_node;
  local_408 = _Var9.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_450,(char (*) [13])"VERTEX_SETUP",&local_470);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_3a0,&local_450);
  local_480 = (_Base_ptr)_Var9.first._M_node;
  local_478 = _Var9.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"gl_Position = dEQP_Position;\n",&local_4e1);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_4c0,(char (*) [14])"VERTEX_OUTPUT",&local_4e0);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_3a0,&local_4c0);
  tmpl.m_template.field_2._8_8_ = _Var9.first._M_node;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,vertexSource,&local_539);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_518,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  tcu::StringTemplate::specialize
            ((string *)&decl_1.field_0x170,(StringTemplate *)local_518,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_3a0);
  std::__cxx11::string::operator=((string *)outVertexSource,(string *)&decl_1.field_0x170);
  std::__cxx11::string::~string((string *)&decl_1.field_0x170);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_518);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_3a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&output.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragColor);
  pcStack_858 = "gl_FragColor";
  if (bVar1) {
    pcStack_858 = "dEQP_FragColor";
  }
  genCompareFunctions((ostringstream *)&output.field_0x170,valueBlock,false);
  genCompareOp((ostringstream *)&fragColor,pcStack_858,valueBlock,"",(char *)0x0);
  if (bVar1) {
    std::operator<<((ostream *)&output.field_0x170,
                    "layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
  }
  for (val_1._4_4_ = 0;
      sVar5 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ::size(&valueBlock->values), val_1._4_4_ < (int)sVar5; val_1._4_4_ = val_1._4_4_ + 1)
  {
    pvVar6 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[](&valueBlock->values,(long)val_1._4_4_);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    params_1._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)glu::getDataTypeName(pvVar6->dataType);
    if (pvVar6->storageType == STORAGE_OUTPUT) {
      poVar4 = std::operator<<((ostream *)&output.field_0x170,"uniform ");
      poVar4 = std::operator<<(poVar4,(char *)params_1._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count);
      poVar4 = std::operator<<(poVar4," ref_");
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::operator<<(poVar4,";\n");
      poVar4 = std::operator<<((ostream *)&output.field_0x170,
                               (char *)params_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::operator<<(poVar4,";\n");
    }
    else if ((pvVar6->storageType == STORAGE_UNIFORM) &&
            (lVar8 = std::__cxx11::string::find((char)pvVar6 + '\b',0x2e), lVar8 == -1)) {
      poVar4 = std::operator<<((ostream *)&output.field_0x170,"uniform ");
      poVar4 = std::operator<<(poVar4,(char *)params_1._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::operator<<(poVar4,";\n");
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_8a8);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[22],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_8e8,(char (*) [22])"FRAGMENT_DECLARATIONS",&local_908);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_8a8,&local_8e8);
  local_918 = (_Base_ptr)_Var9.first._M_node;
  local_910 = _Var9.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::ostringstream::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_958,(char (*) [16])"FRAGMENT_OUTPUT",&local_978);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_8a8,&local_958);
  local_988 = (_Base_ptr)_Var9.first._M_node;
  local_980 = _Var9.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_958);
  std::__cxx11::string::~string((string *)&local_978);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_*&,_true>
            (&local_9c8,(char (*) [11])0x2b3d28e,&stack0xfffffffffffff7a8);
  _Var9 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_8a8,&local_9c8);
  tmpl_1.m_template.field_2._8_8_ = _Var9.first._M_node;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_9c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,fragmentSource,&local_a19)
  ;
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_9f8,&local_a18);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  tcu::StringTemplate::specialize
            (&local_a40,(StringTemplate *)local_9f8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_8a8);
  std::__cxx11::string::operator=((string *)outFragmentSource,(string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_a40);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_9f8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_8a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragColor);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&output.field_0x170);
  return;
}

Assistant:

void ShaderCase::specializeShaders(const char* vertexSource, const char* fragmentSource, string& outVertexSource,
								   string& outFragmentSource, const ValueBlock& valueBlock)
{
	const bool usesInout	  = usesShaderInoutQualifiers(m_targetVersion);
	const bool customColorOut = usesInout;

	// Vertex shader specialization.
	{
		ostringstream decl;
		ostringstream setup;
		const char*   vtxIn = usesInout ? "in" : "attribute";

		decl << vtxIn << " highp vec4 dEQP_Position;\n";

		for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
		{
			const ShaderCase::Value& val	 = valueBlock.values[ndx];
			const char*				 typeStr = getDataTypeName(val.dataType);

			if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
			{
				if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				{
					decl << vtxIn << " " << typeStr << " " << val.valueName << ";\n";
				}
				else
				{
					DataType	floatType	= getDataTypeFloatScalars(val.dataType);
					const char* floatTypeStr = getDataTypeName(floatType);

					decl << vtxIn << " " << floatTypeStr << " a_" << val.valueName << ";\n";
					setup << typeStr << " " << val.valueName << " = " << typeStr << "(a_" << val.valueName << ");\n";
				}
			}
			else if (val.storageType == ShaderCase::Value::STORAGE_UNIFORM && val.valueName.find('.') == string::npos)
			{
				decl << "uniform " << typeStr << " " << val.valueName << ";\n";
			}
		}

		map<string, string> params;
		params.insert(pair<string, string>("VERTEX_DECLARATIONS", decl.str()));
		params.insert(pair<string, string>("VERTEX_SETUP", setup.str()));
		params.insert(pair<string, string>("VERTEX_OUTPUT", string("gl_Position = dEQP_Position;\n")));
		StringTemplate tmpl(vertexSource);
		outVertexSource = tmpl.specialize(params);
	}

	// Fragment shader specialization.
	{
		ostringstream decl;
		ostringstream output;
		const char*   fragColor = customColorOut ? "dEQP_FragColor" : "gl_FragColor";

		genCompareFunctions(decl, valueBlock, false);
		genCompareOp(output, fragColor, valueBlock, "", DE_NULL);

		if (customColorOut)
			decl << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";

		for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
		{
			const ShaderCase::Value& val		= valueBlock.values[ndx];
			const char*				 valueName  = val.valueName.c_str();
			const char*				 refTypeStr = getDataTypeName(val.dataType);

			if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
			{
				decl << "uniform " << refTypeStr << " ref_" << valueName << ";\n";
				decl << refTypeStr << " " << valueName << ";\n";
			}
			else if (val.storageType == ShaderCase::Value::STORAGE_UNIFORM && val.valueName.find('.') == string::npos)
			{
				decl << "uniform " << refTypeStr << " " << valueName << ";\n";
			}
		}

		map<string, string> params;
		params.insert(pair<string, string>("FRAGMENT_DECLARATIONS", decl.str()));
		params.insert(pair<string, string>("FRAGMENT_OUTPUT", output.str()));
		params.insert(pair<string, string>("FRAG_COLOR", fragColor));
		StringTemplate tmpl(fragmentSource);
		outFragmentSource = tmpl.specialize(params);
	}
}